

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

void __thiscall
Js::JavascriptPromise::ExtractSnapObjectDataInto
          (JavascriptPromise *this,SnapObject *objData,SlabAllocator *alloc)

{
  uint uVar1;
  Var v;
  _func_int *p_Var2;
  code *pcVar3;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar4;
  bool bVar5;
  SnapPromiseInfo *addtlInfo;
  undefined4 *puVar6;
  SnapPromiseReactionInfo *pSVar7;
  Type *pTVar8;
  unsigned_long *dependsOnArray;
  Type *pTVar9;
  ulong uVar10;
  uint32 i;
  ulong uVar11;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar12;
  undefined1 local_90 [8];
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> depOnList
  ;
  Iterator local_50;
  SlabAllocator *local_40;
  Type local_38;
  
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>._16_8_ =
       &Memory::HeapAllocator::Instance;
  local_90 = (undefined1  [8])&PTR_IsReadOnly_0152f170;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer._0_4_ =
       0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  depOnList._40_8_ = objData;
  local_40 = alloc;
  addtlInfo = (SnapPromiseInfo *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<48ul>(alloc);
  v = (this->result).ptr;
  addtlInfo->Result = v;
  if (v != (Var)0x0) {
    bVar5 = TTD::JsSupport::IsVarComplexKind(v);
    if (bVar5) {
      p_Var2 = (_func_int *)(this->result).ptr;
      JsUtil::
      List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_90,0);
      depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList
      [(int)(uint)depOnList.
                  super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer]
           = p_Var2;
      depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer.
      _0_4_ = (uint)depOnList.
                    super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer
              + 1;
    }
  }
  addtlInfo->Status = (uint)this->status;
  addtlInfo->isHandled = this->isHandled;
  addtlInfo->ResolveReactionCount = 0;
  pSVar12 = (this->reactions).ptr;
  if (pSVar12 == (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
    addtlInfo->RejectReactionCount = 0;
    addtlInfo->ResolveReactions = (SnapPromiseReactionInfo *)0x0;
    addtlInfo->RejectReactions = (SnapPromiseReactionInfo *)0x0;
  }
  else {
    local_50.list =
         &pSVar12->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>;
    local_50.current = (NodeBase *)pSVar12;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (pSVar12 == (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_00cf1be4;
        *puVar6 = 0;
        pSVar12 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                  local_50.current;
      }
      pSVar4 = local_50.list;
      pSVar12 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                (pSVar12->
                super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>).
                super_SListNodeBase<Memory::Recycler>.next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar12;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      if ((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)local_38.ptr
          == pSVar4) break;
      pSVar12 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                (((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                 &(local_50.current)->next)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar12;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      local_50.current = local_38.ptr;
      SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::Data
                (&local_50);
      addtlInfo->ResolveReactionCount = addtlInfo->ResolveReactionCount + 1;
      pSVar12 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                local_50.current;
    }
    uVar1 = addtlInfo->ResolveReactionCount;
    addtlInfo->RejectReactionCount = uVar1;
    addtlInfo->ResolveReactions = (SnapPromiseReactionInfo *)0x0;
    addtlInfo->RejectReactions = (SnapPromiseReactionInfo *)0x0;
    if ((ulong)uVar1 != 0) {
      pSVar7 = TTD::SlabAllocatorBase<0>::
               SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(local_40,(ulong)uVar1);
      addtlInfo->ResolveReactions = pSVar7;
      pSVar7 = TTD::SlabAllocatorBase<0>::
               SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>
                         (local_40,(ulong)addtlInfo->RejectReactionCount);
      addtlInfo->RejectReactions = pSVar7;
      local_50.list =
           &((this->reactions).ptr)->
            super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>;
      uVar10 = 0;
      local_50.current = &(local_50.list)->super_SListNodeBase<Memory::Recycler>;
      do {
        if ((SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
            local_50.current ==
            (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) {
LAB_00cf1be4:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        pSVar4 = local_50.list;
        pSVar12 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                  (((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                   &(local_50.current)->next)->super_SListNodeBase<Memory::Recycler>).next.ptr;
        Memory::Recycler::WBSetBit((char *)&local_38);
        local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar12;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
        if ((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
            local_38.ptr == pSVar4) break;
        pSVar12 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                  (((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                   &(local_50.current)->next)->super_SListNodeBase<Memory::Recycler>).next.ptr;
        Memory::Recycler::WBSetBit((char *)&local_38);
        local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar12;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
        local_50.current = local_38.ptr;
        pTVar8 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator
                 ::Data(&local_50);
        JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
                  (pTVar8->resolveReaction,addtlInfo->ResolveReactions + uVar10,
                   (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)local_90,local_40);
        pTVar8 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator
                 ::Data(&local_50);
        JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
                  (pTVar8->rejectReaction,addtlInfo->RejectReactions + uVar10,
                   (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)local_90,local_40);
        uVar10 = (ulong)((int)uVar10 + 1);
      } while( true );
    }
  }
  uVar1 = (uint)depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                buffer;
  uVar10 = (ulong)(uint)depOnList.
                        super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                        buffer;
  if (uVar10 == 0) {
    if (*(int *)(depOnList._40_8_ + 8) != 0x1c) {
      TTDAbort_unrecoverable_error("Tag does not match.");
    }
    *(SnapPromiseInfo **)(depOnList._40_8_ + 0x40) = addtlInfo;
  }
  else {
    dependsOnArray = TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>(local_40,uVar10);
    uVar11 = 0;
    do {
      pTVar9 = JsUtil::
               List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_90,(int)uVar11);
      dependsOnArray[uVar11] = *pTVar9;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
              ((SnapObject *)depOnList._40_8_,addtlInfo,local_40,uVar1,dependsOnArray);
  }
  local_90 = (undefined1  [8])&PTR_IsReadOnly_0152f170;
  if (depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList != (_func_int **)0x0) {
    Memory::HeapAllocator::Free
              ((HeapAllocator *)
               depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
               _16_8_,depOnList.
                      super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                      _vptr_ReadOnlyList,
               (long)(int)depOnList.
                          super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                          alloc << 3);
  }
  return;
}

Assistant:

void JavascriptPromise::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        JsUtil::List<TTD_PTR_ID, HeapAllocator> depOnList(&HeapAllocator::Instance);

        TTD::NSSnapObjects::SnapPromiseInfo* spi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseInfo>();

        spi->Result = this->result;

        //Primitive kinds always inflated first so we only need to deal with complex kinds as depends on
        if(this->result != nullptr && TTD::JsSupport::IsVarComplexKind(this->result))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->result));
        }

        spi->Status = this->GetStatus();
        spi->isHandled = this->GetIsHandled();

        // get count of # of reactions
        spi->ResolveReactionCount = 0;
        if (this->reactions != nullptr)
        {
            this->reactions->Map([&spi](JavascriptPromiseReactionPair pair) {
                spi->ResolveReactionCount++;
            });
        }
        spi->RejectReactionCount = spi->ResolveReactionCount;

        // move resolve & reject reactions into slab
        spi->ResolveReactions = nullptr;
        spi->RejectReactions = nullptr;
        if(spi->ResolveReactionCount != 0)
        {
            spi->ResolveReactions = alloc.SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(spi->ResolveReactionCount);
            spi->RejectReactions = alloc.SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(spi->RejectReactionCount);

            JavascriptPromiseReactionList::Iterator it = this->reactions->GetIterator();
            uint32 i = 0;
            while (it.Next())
            {
                it.Data().resolveReaction->ExtractSnapPromiseReactionInto(spi->ResolveReactions + i, depOnList, alloc);
                it.Data().rejectReaction->ExtractSnapPromiseReactionInto(spi->RejectReactions + i, depOnList, alloc);
                ++i;
            }
        }

        //see what we need to do wrt dependencies
        if(depOnList.Count() == 0)
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseObject>(objData, spi);
        }
        else
        {
            uint32 depOnCount = depOnList.Count();
            TTD_PTR_ID* depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);

            for(uint32 i = 0; i < depOnCount; ++i)
            {
                depOnArray[i] = depOnList.Item(i);
            }

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseObject>(objData, spi, alloc, depOnCount, depOnArray);
        }
    }